

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visitCallIndirect(wasm::CallIndirect__(void *this,CallIndirect *curr)

{
  size_t sVar1;
  Expression *pEVar2;
  char *pcVar3;
  Value *this_00;
  ScopedTemp *this_01;
  bool bVar4;
  JsType JVar5;
  Ref RVar6;
  void *pvVar7;
  undefined8 *puVar8;
  Value *pVVar9;
  Ref RVar10;
  Ref RVar11;
  long lVar12;
  Ref *pRVar13;
  ulong uVar14;
  ulong uVar15;
  iterator __end3;
  ulong uVar16;
  ulong uVar17;
  undefined8 *puVar18;
  ulong uVar19;
  bool bVar20;
  IString nextResult;
  IString nextResult_00;
  IString op;
  IString possible;
  IString possible_00;
  undefined1 local_368 [8];
  EffectAnalyzer targetEffects;
  undefined1 local_1e0 [8];
  ScopedTemp idx;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_198;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_168;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_138;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_e0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_b0;
  Value *local_80;
  Ref local_78;
  Ref theCall;
  undefined8 *local_58;
  Ref local_48;
  Ref ret;
  undefined8 *local_38;
  
  if (curr->isReturn == true) {
    Fatal::Fatal((Fatal *)local_368);
    Fatal::operator<<((Fatal *)local_368,(char (*) [40])"tail calls not yet supported in wasm2js");
    Fatal::~Fatal((Fatal *)local_368);
  }
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)local_368,(PassOptions *)(*this + 0x60),
             *(Module **)((long)this + 0x20),curr->target);
  bVar4 = EffectAnalyzer::hasAnything((EffectAnalyzer *)local_368);
  ret.inst = (Value *)curr;
  if ((bVar4) &&
     (sVar1 = (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements, sVar1 != 0)) {
    uVar17 = 0;
    do {
      if (ret.inst[1].field_1.str.str._M_len <= uVar17) goto LAB_00d03e94;
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)local_1e0,(PassOptions *)(*this + 0x60),
                 *(Module **)((long)this + 0x20),
                 *(Expression **)(*(long *)(ret.inst + 1) + uVar17 * 8));
      bVar4 = EffectAnalyzer::invalidates((EffectAnalyzer *)local_368,(EffectAnalyzer *)local_1e0);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_b0);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_e0);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_138);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_168);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_198);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&idx.temp);
      bVar20 = sVar1 - 1 != uVar17;
      uVar17 = uVar17 + 1;
    } while (bVar20 && !bVar4);
  }
  else {
    bVar4 = false;
  }
  nextResult.str._M_str = DAT_010b10b8;
  nextResult.str._M_len = EXPRESSION_RESULT;
  RVar6 = visit(wasm::Expression*,wasm::IString_
                    (this,(Expression *)ret.inst[2].field_1.arr,nextResult);
  RVar6 = makeJsCoercion(RVar6,JS_INT);
  pcVar3 = DAT_010b1098;
  sVar1 = FUNCTION_TABLE;
  if (bVar4 == false) {
    pvVar7 = (void *)0x18;
    RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (RVar10.inst)->type = Null;
    cashew::Value::free(RVar10.inst,pvVar7);
    (RVar10.inst)->type = String;
    ((RVar10.inst)->field_1).str.str._M_len = sVar1;
    ((RVar10.inst)->field_1).str.str._M_str = pcVar3;
    RVar6 = cashew::ValueBuilder::makeSub(RVar10,RVar6);
    local_48 = cashew::ValueBuilder::makeCall(RVar6);
    uVar17 = ret.inst[1].field_1.str.str._M_len;
    if (uVar17 != 0) {
      uVar19 = 0;
      do {
        if (ret.inst[1].field_1.str.str._M_len <= uVar19) goto LAB_00d03e94;
        pEVar2 = *(Expression **)(*(long *)(ret.inst + 1) + uVar19 * 8);
        pRVar13 = cashew::Ref::operator[](&local_48,2);
        pVVar9 = pRVar13->inst;
        nextResult_00.str._M_str = DAT_010b10b8;
        nextResult_00.str._M_len = EXPRESSION_RESULT;
        RVar6 = visit(wasm::Expression*,wasm::IString_(this,pEVar2,nextResult_00);
        cashew::Value::push_back(pVVar9,RVar6);
        uVar19 = uVar19 + 1;
      } while (uVar17 != uVar19);
    }
    RVar6.inst = local_48.inst;
    JVar5 = wasmToJsType((Type)((ret.inst)->field_1).ref.inst);
    local_48 = makeJsCoercion(RVar6,JVar5);
  }
  else {
    local_48.inst = (Value *)0x0;
    possible.str._M_str = DAT_010b10a8;
    possible.str._M_len = (size_t)NO_RESULT;
    RVar10.inst = NO_RESULT;
    ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
              (local_1e0,(Type)0x2,*this,*(Function **)((long)this + 0x18),possible);
    theCall.inst = ret.inst[1].field_1.ref.inst;
    local_80 = RVar6.inst;
    if (theCall.inst == (Value *)0x0) {
      RVar6.inst = (Value *)0x0;
      local_58 = (undefined8 *)0x0;
      puVar18 = (undefined8 *)0x0;
      local_38 = (undefined8 *)0x0;
    }
    else {
      local_38 = (undefined8 *)0x0;
      puVar18 = (undefined8 *)0x0;
      local_58 = (undefined8 *)0x0;
      pVVar9 = (Value *)0x0;
      RVar11 = ret;
      do {
        if ((Value *)RVar11.inst[1].field_1.str.str._M_len <= pVVar9) goto LAB_00d03e94;
        pEVar2 = *(Expression **)(*(long *)(RVar11.inst + 1) + (long)pVVar9 * 8);
        pvVar7 = operator_new(0x28);
        possible_00.str._M_str = DAT_010b10a8;
        possible_00.str._M_len = (size_t)NO_RESULT;
        RVar10.inst = NO_RESULT;
        ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
                  (pvVar7,(Type)(pEVar2->type).id,*this,*(Function **)((long)this + 0x18),
                   possible_00);
        if (puVar18 == local_58) {
          uVar17 = (long)puVar18 - (long)local_38;
          if (uVar17 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar16 = (long)uVar17 >> 3;
          uVar19 = 1;
          if (puVar18 != local_38) {
            uVar19 = uVar16;
          }
          uVar14 = uVar19 + uVar16;
          if (0xffffffffffffffe < uVar14) {
            uVar14 = 0xfffffffffffffff;
          }
          uVar15 = 0xfffffffffffffff;
          if (!CARRY8(uVar19,uVar16)) {
            uVar15 = uVar14;
          }
          if (uVar15 == 0) {
            puVar8 = (undefined8 *)0x0;
          }
          else {
            puVar8 = (undefined8 *)operator_new(uVar15 * 8);
          }
          puVar8[uVar16] = pvVar7;
          if (0 < (long)uVar17) {
            memmove(puVar8,local_38,uVar17);
          }
          if (local_38 != (undefined8 *)0x0) {
            operator_delete(local_38,uVar17);
          }
          puVar18 = (undefined8 *)(uVar17 + (long)puVar8);
          local_58 = puVar8 + uVar15;
          pvVar7 = (void *)*puVar18;
          local_38 = puVar8;
        }
        else {
          *puVar18 = pvVar7;
        }
        RVar6 = visitAndAssign(wasm::Expression*,wasm::IString_
                          (this,pEVar2,(IString)*(string_view *)((long)pvVar7 + 0x10));
        RVar11 = ret;
        if (local_48.inst != (Value *)0x0) {
          RVar6 = cashew::ValueBuilder::makeSeq(local_48,RVar6);
        }
        puVar18 = puVar18 + 1;
        pVVar9 = (Value *)((long)&pVVar9->type + 1);
        local_48.inst = RVar6.inst;
      } while (theCall.inst != pVVar9);
    }
    pvVar7 = (void *)0x18;
    pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    pVVar9->type = Null;
    cashew::Value::free(pVVar9,pvVar7);
    pVVar9->type = String;
    (pVVar9->field_1).ref.inst = (Value *)idx.type.id;
    (pVVar9->field_1).str.str._M_str = (char *)idx.temp.str._M_len;
    op.str._M_str = (char *)local_80;
    op.str._M_len = DAT_010b1770;
    RVar10 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar9,cashew::SET,op,RVar10);
    if (RVar6.inst != (Value *)0x0) {
      RVar10 = cashew::ValueBuilder::makeSeq(RVar6,RVar10);
    }
    pcVar3 = DAT_010b1098;
    sVar1 = FUNCTION_TABLE;
    pvVar7 = (void *)0x18;
    local_48.inst = RVar10.inst;
    RVar6.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (RVar6.inst)->type = Null;
    cashew::Value::free(RVar6.inst,pvVar7);
    (RVar6.inst)->type = String;
    ((RVar6.inst)->field_1).str.str._M_len = sVar1;
    ((RVar6.inst)->field_1).str.str._M_str = pcVar3;
    pvVar7 = (void *)0x18;
    RVar11.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (RVar11.inst)->type = Null;
    cashew::Value::free(RVar11.inst,pvVar7);
    (RVar11.inst)->type = String;
    ((RVar11.inst)->field_1).ref.inst = (Value *)idx.type.id;
    ((RVar11.inst)->field_1).str.str._M_str = (char *)idx.temp.str._M_len;
    RVar6 = cashew::ValueBuilder::makeSub(RVar6,RVar11);
    local_78 = cashew::ValueBuilder::makeCall(RVar6);
    if ((long)puVar18 - (long)local_38 != 0) {
      lVar12 = (long)puVar18 - (long)local_38 >> 3;
      theCall.inst = (Value *)(lVar12 + (ulong)(lVar12 == 0));
      pVVar9 = (Value *)0x0;
      do {
        if ((Value *)ret.inst[1].field_1.str.str._M_len <= pVVar9) {
LAB_00d03e94:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        sVar1 = *(size_t *)(local_38[(long)pVVar9] + 0x10);
        pcVar3 = *(char **)(local_38[(long)pVVar9] + 0x18);
        lVar12 = *(long *)(ret.inst + 1);
        pRVar13 = cashew::Ref::operator[](&local_78,2);
        this_00 = pRVar13->inst;
        pvVar7 = (void *)0x18;
        RVar6.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        (RVar6.inst)->type = Null;
        cashew::Value::free(RVar6.inst,pvVar7);
        (RVar6.inst)->type = String;
        ((RVar6.inst)->field_1).str.str._M_len = sVar1;
        ((RVar6.inst)->field_1).str.str._M_str = pcVar3;
        JVar5 = wasmToJsType((Type)*(uintptr_t *)(*(long *)(lVar12 + (long)pVVar9 * 8) + 8));
        RVar6 = makeJsCoercion(RVar6,JVar5);
        cashew::Value::push_back(this_00,RVar6);
        pVVar9 = (Value *)((long)&pVVar9->type + 1);
      } while (theCall.inst != pVVar9);
    }
    RVar6.inst = local_78.inst;
    JVar5 = wasmToJsType((Type)((ret.inst)->field_1).ref.inst);
    local_78 = makeJsCoercion(RVar6,JVar5);
    RVar6 = local_78;
    puVar8 = local_38;
    if (RVar10.inst != (Value *)0x0) {
      RVar6 = cashew::ValueBuilder::makeSeq(RVar10,local_78);
    }
    for (; local_48.inst = RVar6.inst, puVar18 != puVar8; puVar8 = puVar8 + 1) {
      this_01 = (ScopedTemp *)*puVar8;
      if (this_01 != (ScopedTemp *)0x0) {
        processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp(this_01);
      }
      operator_delete(this_01,0x28);
      RVar6.inst = local_48.inst;
    }
    if (local_38 != (undefined8 *)0x0) {
      operator_delete(local_38,(long)local_58 - (long)local_38);
    }
    processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)local_1e0);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&targetEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&targetEffects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&targetEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&targetEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&targetEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&targetEffects.features);
  return (Ref)local_48.inst;
}

Assistant:

Ref visitCallIndirect(CallIndirect* curr) {
      if (curr->isReturn) {
        Fatal() << "tail calls not yet supported in wasm2js";
      }
      // If the target has effects that interact with the operands, we must
      // reorder it to the start.
      bool mustReorder = false;
      EffectAnalyzer targetEffects(parent->options, *module, curr->target);
      if (targetEffects.hasAnything()) {
        for (auto* operand : curr->operands) {
          if (targetEffects.invalidates(
                EffectAnalyzer(parent->options, *module, operand))) {
            mustReorder = true;
            break;
          }
        }
      }
      // Ensure the function pointer is a number. In general in wasm2js we are
      // ok with true/false being present, as they are immediately cast to a
      // number anyhow on their use. However, FUNCTION_TABLE[true] is *not* the
      // same as FUNCTION_TABLE[1], so we must cast. This is a rare exception
      // because FUNCTION_TABLE is just a normal JS object, not a typed array
      // or a mathematical operation (all of which coerce to a number for us).
      auto target = visit(curr->target, EXPRESSION_RESULT);
      target = makeJsCoercion(target, JS_INT);
      if (mustReorder) {
        Ref ret;
        ScopedTemp idx(Type::i32, parent, func);
        std::vector<ScopedTemp*> temps; // TODO: utility class, with destructor?
        for (auto* operand : curr->operands) {
          temps.push_back(new ScopedTemp(operand->type, parent, func));
          IString temp = temps.back()->temp;
          sequenceAppend(ret, visitAndAssign(operand, temp));
        }
        sequenceAppend(ret,
                       ValueBuilder::makeBinary(
                         ValueBuilder::makeName(idx.getName()), SET, target));
        Ref theCall = ValueBuilder::makeCall(ValueBuilder::makeSub(
          ValueBuilder::makeName(FUNCTION_TABLE), idx.getAstName()));
        for (size_t i = 0; i < temps.size(); i++) {
          IString temp = temps[i]->temp;
          auto& operand = curr->operands[i];
          theCall[2]->push_back(makeJsCoercion(ValueBuilder::makeName(temp),
                                               wasmToJsType(operand->type)));
        }
        theCall = makeJsCoercion(theCall, wasmToJsType(curr->type));
        sequenceAppend(ret, theCall);
        for (auto temp : temps) {
          delete temp;
        }
        return ret;
      } else {
        // Target has no side effects, emit simple code
        Ref theCall = ValueBuilder::makeCall(ValueBuilder::makeSub(
          ValueBuilder::makeName(FUNCTION_TABLE), target));
        for (auto* operand : curr->operands) {
          theCall[2]->push_back(visit(operand, EXPRESSION_RESULT));
        }
        theCall = makeJsCoercion(theCall, wasmToJsType(curr->type));
        return theCall;
      }
    }